

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_change_term_val(lyd_node *term,lyd_value *val,ly_bool use_val,ly_bool is_dflt)

{
  lysc_node *plVar1;
  bool bVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  LY_ERR LVar6;
  lyd_node *plVar7;
  ly_ctx *local_68;
  ly_ctx *local_60;
  ly_ctx *local_50;
  LY_ERR ret__;
  ly_bool val_change;
  ly_bool dflt_change;
  lyd_node_term *t;
  lysc_type *type;
  LY_ERR rc;
  ly_bool is_dflt_local;
  ly_bool use_val_local;
  lyd_value *val_local;
  lyd_node *term_local;
  
  type._0_4_ = LY_SUCCESS;
  plVar1 = term->schema[1].parent;
  if (term->schema == (lysc_node *)0x0) {
    local_50 = (ly_ctx *)term[2].schema;
  }
  else {
    local_50 = term->schema->module->ctx;
  }
  iVar5 = (*(code *)plVar1->parent->next)(local_50,term + 1,val);
  if (iVar5 == 0) {
    if (use_val != '\0') {
      if (term->schema == (lysc_node *)0x0) {
        local_60 = (ly_ctx *)term[2].schema;
      }
      else {
        local_60 = term->schema->module->ctx;
      }
      (*(code *)plVar1->parent->ref)(local_60,val);
    }
    bVar3 = false;
  }
  else {
    if (((term->flags & 1) != 0) && (is_dflt != '\0')) {
      __assert_fail("!(term->flags & LYD_DEFAULT) || !is_dflt",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_new.c"
                    ,0x52d,
                    "LY_ERR lyd_change_term_val(struct lyd_node *, struct lyd_value *, ly_bool, ly_bool)"
                   );
    }
    LVar6 = lyd_change_node_value((lyd_node_term *)term,val,use_val);
    if (LVar6 != LY_SUCCESS) {
      return LVar6;
    }
    bVar3 = true;
  }
  if (bVar3) {
    if (term->schema == (lysc_node *)0x0) {
      local_68 = (ly_ctx *)term[2].schema;
    }
    else {
      local_68 = term->schema->module->ctx;
    }
    uVar4 = ly_ctx_get_options(local_68);
    if ((uVar4 & 0x400) != 0) {
      lyd_free_leafref_nodes((lyd_node_term *)term);
    }
  }
  if (bVar3) {
    term->flags = term->flags | 4;
  }
  if (((term->flags & 1) == 0) || (is_dflt != '\0')) {
    if (((term->flags & 1) == 0) && (is_dflt != '\0')) {
      term->flags = term->flags | 1;
      plVar7 = lyd_parent(term);
      lyd_np_cont_dflt_set(plVar7);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  else {
    term->flags = term->flags & 0xfffffffe;
    plVar7 = lyd_parent(term);
    lyd_np_cont_dflt_del(plVar7);
    bVar2 = true;
  }
  if ((!bVar3) && (type._0_4_ = LY_ENOT, bVar2)) {
    type._0_4_ = LY_EEXIST;
  }
  return (LY_ERR)type;
}

Assistant:

LY_ERR
lyd_change_term_val(struct lyd_node *term, struct lyd_value *val, ly_bool use_val, ly_bool is_dflt)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_type *type;
    struct lyd_node_term *t;
    ly_bool dflt_change, val_change;

    t = (struct lyd_node_term *)term;
    type = ((struct lysc_node_leaf *)term->schema)->type;

    /* compare original and new value */
    if (type->plugin->compare(LYD_CTX(term), &t->value, val)) {
        /* since they are different, they cannot both be default */
        assert(!(term->flags & LYD_DEFAULT) || !is_dflt);

        /* values differ, switch them */
        LY_CHECK_RET(lyd_change_node_value(t, val, use_val));
        val_change = 1;
    } else {
        /* same values, free the new stored one */
        if (use_val) {
            type->plugin->free(LYD_CTX(term), val);
        }
        val_change = 0;
    }

    /* clear links to leafref nodes */
    if (val_change && (ly_ctx_get_options(LYD_CTX(term)) & LY_CTX_LEAFREF_LINKING)) {
        lyd_free_leafref_nodes(t);
    }

    /* update flags */
    if (val_change) {
        term->flags |= LYD_NEW;
    }
    if ((term->flags & LYD_DEFAULT) && !is_dflt) {
        /* remove dflt flag */
        term->flags &= ~LYD_DEFAULT;

        /* remove parent dflt flag */
        lyd_np_cont_dflt_del(lyd_parent(term));

        dflt_change = 1;
    } else if (!(term->flags & LYD_DEFAULT) && is_dflt) {
        /* add dflt flag */
        term->flags |= LYD_DEFAULT;

        /* add parent dflt flag */
        lyd_np_cont_dflt_set(lyd_parent(term));

        dflt_change = 1;
    } else {
        dflt_change = 0;
    }

    if (!val_change) {
        /* only default flag change or no change */
        rc = dflt_change ? LY_EEXIST : LY_ENOT;
    } /* else value changed, LY_SUCCESS */

    return rc;
}